

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O2

int ffphbn(fitsfile *fptr,LONGLONG naxis2,int tfields,char **ttype,char **tform,char **tunit,
          char *extnmx,LONGLONG pcount,int *status)

{
  char **ppcVar1;
  ulong uVar2;
  int iVar3;
  FITSfile *pFVar4;
  long lVar5;
  size_t sVar6;
  char *pcVar7;
  char *pcVar8;
  LONGLONG value;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  int datatype;
  char comm [73];
  long repeat;
  char **local_188;
  char **local_180;
  ulong local_178;
  char **local_170;
  long width;
  ulong local_160;
  char name [75];
  char card [81];
  char extnm [71];
  char tfmt [30];
  
  iVar11 = *status;
  if (iVar11 < 1) {
    iVar11 = fptr->HDUposition;
    pFVar4 = fptr->Fptr;
    local_180 = ttype;
    if (iVar11 != pFVar4->curhdu) {
      ffmahd(fptr,iVar11 + 1,(int *)0x0,status);
      pFVar4 = fptr->Fptr;
      iVar11 = pFVar4->curhdu;
    }
    if (pFVar4->headend == pFVar4->headstart[iVar11]) {
      if (naxis2 < 0) {
        *status = 0xda;
        iVar11 = 0xda;
      }
      else if (pcount < 0) {
        *status = 0xd6;
        iVar11 = 0xd6;
      }
      else if ((uint)tfields < 1000) {
        extnm[0] = '\0';
        local_188 = tunit;
        local_170 = tform;
        if (extnmx != (char *)0x0) {
          strncat(extnm,extnmx,0x46);
        }
        ffpkys(fptr,"XTENSION","BINTABLE","binary table extension",status);
        ffpkyj(fptr,"BITPIX",8,"8-bit bytes",status);
        ffpkyj(fptr,"NAXIS",2,"2-dimensional binary table",status);
        local_178 = (ulong)(uint)tfields;
        uVar9 = 0;
        value = 0;
        do {
          if (local_178 == uVar9) break;
          ffbnfm(local_170[uVar9],&datatype,&repeat,&width,status);
          if (datatype == 1) {
            lVar5 = (repeat + 7) / 8;
          }
          else {
            lVar5 = repeat;
            if (datatype != 0x10) {
              if (datatype < 1) {
                lVar5 = 8;
                if ((byte)(*local_170[uVar9] | 0x20U) != 0x70) {
                  lVar5 = (ulong)((local_170[uVar9][1] + 0xb0U & 0xdf) != 0) * 8 + 8;
                }
              }
              else {
                lVar5 = ((ulong)(uint)datatype / 10) * repeat;
              }
            }
          }
          value = value + lVar5;
          uVar9 = uVar9 + 1;
        } while (*status < 1);
        ffpkyj(fptr,"NAXIS1",value,"width of table in bytes",status);
        ffpkyj(fptr,"NAXIS2",naxis2,"number of rows in table",status);
        ffpkyj(fptr,"PCOUNT",0,"size of special data area",status);
        ffpkyj(fptr,"GCOUNT",1,"one data group (required keyword)",status);
        ffpkyj(fptr,"TFIELDS",local_178,"number of fields in each row",status);
        uVar9 = 0;
        do {
          ppcVar1 = local_180;
          if (uVar9 == local_178) break;
          if (*local_180[uVar9] != '\0') {
            uVar10 = (int)uVar9 + 1;
            snprintf(comm,0x49,"label for field %3d",(ulong)uVar10);
            ffkeyn("TTYPE",uVar10,name,status);
            ffpkys(fptr,name,ppcVar1[uVar9],comm,status);
          }
          pcVar8 = local_170[uVar9];
          sVar6 = strlen(pcVar8);
          if (0x1d < sVar6) {
            ffpmsg("Error: BIN table TFORM code is too long (ffphbn)");
            *status = 0x105;
            break;
          }
          strcpy(tfmt,pcVar8);
          ffupch(tfmt);
          iVar11 = (int)(uVar9 + 1);
          local_160 = uVar9;
          ffkeyn("TFORM",iVar11,name,status);
          builtin_strncpy(comm + 0x10,"ield",4);
          comm._20_4_ = comm._20_4_ & 0xffffff00;
          builtin_strncpy(comm,"data format of f",0x10);
          ffbnfm(tfmt,&datatype,&repeat,&width,status);
          switch(datatype) {
          case 0xb:
            sVar6 = strlen(comm);
            builtin_strncpy(comm + sVar6,": BYTE",7);
            break;
          case 0xc:
          case 0xd:
          case 0xf:
          case 0x11:
          case 0x12:
          case 0x13:
switchD_001a086c_caseD_c:
            if (datatype < 0) {
              sVar6 = strlen(comm);
              builtin_strncpy(comm + sVar6 + 0x10,"h array",8);
              uVar13._0_1_ = ':';
              uVar13._1_1_ = ' ';
              uVar13._2_1_ = 'v';
              uVar13._3_1_ = 'a';
              uVar16._0_1_ = 'r';
              uVar16._1_1_ = 'i';
              uVar16._2_1_ = 'a';
              uVar16._3_1_ = 'b';
              uVar19._0_1_ = 'l';
              uVar19._1_1_ = 'e';
              uVar19._2_1_ = ' ';
              uVar19._3_1_ = 'l';
              uVar21._0_1_ = 'e';
              uVar21._1_1_ = 'n';
              uVar21._2_1_ = 'g';
              uVar21._3_1_ = 't';
LAB_001a0d27:
              *(undefined4 *)(comm + sVar6) = uVar13;
              *(undefined4 *)(comm + sVar6 + 4) = uVar16;
              *(undefined4 *)(comm + sVar6 + 8) = uVar19;
              *(undefined4 *)(comm + sVar6 + 0xc) = uVar21;
            }
            break;
          case 0xe:
            sVar6 = strlen(comm);
            uVar12._0_1_ = ':';
            uVar12._1_1_ = ' ';
            uVar12._2_1_ = '1';
            uVar12._3_1_ = '-';
            uVar15._0_1_ = 'b';
            uVar15._1_1_ = 'y';
            uVar15._2_1_ = 't';
            uVar15._3_1_ = 'e';
            uVar18._0_1_ = ' ';
            uVar18._1_1_ = 'L';
            uVar18._2_1_ = 'O';
            uVar18._3_1_ = 'G';
            uVar20._0_1_ = 'I';
            uVar20._1_1_ = 'C';
            uVar20._2_1_ = 'A';
            uVar20._3_1_ = 'L';
            goto LAB_001a0910;
          case 0x10:
            sVar6 = strlen(comm);
            builtin_strncpy(comm + sVar6,": ASCII Character",0x12);
            pcVar8 = strchr(tfmt,0x41);
            iVar3 = __isoc99_sscanf(pcVar8 + 1,"%ld",&width);
            if ((iVar3 == 1) && (repeat < width)) {
              if (repeat == 1) {
                builtin_strncpy(comm + 0x10,"SCII TABLE SYNTAX BY MISTAKE??",0x1f);
                uVar14._0_1_ = 'E';
                uVar14._1_1_ = 'R';
                uVar14._2_1_ = 'R';
                uVar14._3_1_ = 'O';
                uVar17._0_1_ = 'R';
                uVar17._1_1_ = '?';
                uVar17._2_1_ = '?';
                uVar17._3_1_ = ' ';
                comm[8] = ' ';
                comm[9] = 'U';
                comm[10] = 'S';
                comm[0xb] = 'I';
                comm[0xc] = 'N';
                comm[0xd] = 'G';
                comm[0xe] = ' ';
                comm[0xf] = 'A';
              }
              else {
                builtin_strncpy(comm + 0x10,"! UNIT WIDTH w > COLUMN WIDTH r",0x20);
                uVar14._0_1_ = 'r';
                uVar14._1_1_ = 'A';
                uVar14._2_1_ = 'w';
                uVar14._3_1_ = ' ';
                uVar17._0_1_ = 'F';
                uVar17._1_1_ = 'O';
                uVar17._2_1_ = 'R';
                uVar17._3_1_ = 'M';
                comm[8] = 'A';
                comm[9] = 'T';
                comm[10] = ' ';
                comm[0xb] = 'E';
                comm[0xc] = 'R';
                comm[0xd] = 'R';
                comm[0xe] = 'O';
                comm[0xf] = 'R';
              }
              comm[4] = (char)uVar17;
              comm[5] = SUB41(uVar17,1);
              comm[6] = SUB41(uVar17,2);
              comm[7] = SUB41(uVar17,3);
              comm[0] = (char)uVar14;
              comm[1] = SUB41(uVar14,1);
              comm[2] = SUB41(uVar14,2);
              comm[3] = SUB41(uVar14,3);
            }
            break;
          case 0x14:
          case 0x15:
            sVar6 = strlen(comm);
            uVar12._0_1_ = ':';
            uVar12._1_1_ = ' ';
            uVar12._2_1_ = '2';
            uVar12._3_1_ = '-';
            uVar15._0_1_ = 'b';
            uVar15._1_1_ = 'y';
            uVar15._2_1_ = 't';
            uVar15._3_1_ = 'e';
            uVar18._0_1_ = ' ';
            uVar18._1_1_ = 'I';
            uVar18._2_1_ = 'N';
            uVar18._3_1_ = 'T';
            uVar20._0_1_ = 'E';
            uVar20._1_1_ = 'G';
            uVar20._2_1_ = 'E';
            uVar20._3_1_ = 'R';
LAB_001a0910:
            *(undefined4 *)(comm + sVar6) = uVar12;
            *(undefined4 *)(comm + sVar6 + 4) = uVar15;
            *(undefined4 *)(comm + sVar6 + 8) = uVar18;
            *(undefined4 *)(comm + sVar6 + 0xc) = uVar20;
            comm[sVar6 + 0x10] = '\0';
            break;
          default:
            switch(datatype) {
            case 0x50:
            case 0x51:
              sVar6 = strlen(comm);
              uVar12._0_1_ = ':';
              uVar12._1_1_ = ' ';
              uVar12._2_1_ = '8';
              uVar12._3_1_ = '-';
              uVar15._0_1_ = 'b';
              uVar15._1_1_ = 'y';
              uVar15._2_1_ = 't';
              uVar15._3_1_ = 'e';
              uVar18._0_1_ = ' ';
              uVar18._1_1_ = 'I';
              uVar18._2_1_ = 'N';
              uVar18._3_1_ = 'T';
              uVar20._0_1_ = 'E';
              uVar20._1_1_ = 'G';
              uVar20._2_1_ = 'E';
              uVar20._3_1_ = 'R';
              goto LAB_001a0910;
            case 0x52:
              sVar6 = strlen(comm);
              uVar13._0_1_ = ':';
              uVar13._1_1_ = ' ';
              uVar13._2_1_ = '8';
              uVar13._3_1_ = '-';
              uVar16._0_1_ = 'b';
              uVar16._1_1_ = 'y';
              uVar16._2_1_ = 't';
              uVar16._3_1_ = 'e';
              uVar19._0_1_ = ' ';
              uVar19._1_1_ = 'D';
              uVar19._2_1_ = 'O';
              uVar19._3_1_ = 'U';
              uVar21._0_1_ = 'B';
              uVar21._1_1_ = 'L';
              uVar21._2_1_ = 'E';
              uVar21._3_1_ = '\0';
              goto LAB_001a0d27;
            case 0x53:
              sVar6 = strlen(comm);
              builtin_strncpy(comm + sVar6,": COMPLEX",10);
              break;
            default:
              if (datatype != 1) {
                if ((datatype == 0x28) || (datatype == 0x29)) {
                  sVar6 = strlen(comm);
                  uVar12._0_1_ = ':';
                  uVar12._1_1_ = ' ';
                  uVar12._2_1_ = '4';
                  uVar12._3_1_ = '-';
                  uVar15._0_1_ = 'b';
                  uVar15._1_1_ = 'y';
                  uVar15._2_1_ = 't';
                  uVar15._3_1_ = 'e';
                  uVar18._0_1_ = ' ';
                  uVar18._1_1_ = 'I';
                  uVar18._2_1_ = 'N';
                  uVar18._3_1_ = 'T';
                  uVar20._0_1_ = 'E';
                  uVar20._1_1_ = 'G';
                  uVar20._2_1_ = 'E';
                  uVar20._3_1_ = 'R';
                }
                else {
                  if (datatype == 0x2a) {
                    sVar6 = strlen(comm);
                    builtin_strncpy(comm + sVar6,": 4-byte REAL",0xe);
                    break;
                  }
                  if (datatype != 0xa3) goto switchD_001a086c_caseD_c;
                  sVar6 = strlen(comm);
                  uVar12._0_1_ = ':';
                  uVar12._1_1_ = ' ';
                  uVar12._2_1_ = 'D';
                  uVar12._3_1_ = 'O';
                  uVar15._0_1_ = 'U';
                  uVar15._1_1_ = 'B';
                  uVar15._2_1_ = 'L';
                  uVar15._3_1_ = 'E';
                  uVar18._0_1_ = ' ';
                  uVar18._1_1_ = 'C';
                  uVar18._2_1_ = 'O';
                  uVar18._3_1_ = 'M';
                  uVar20._0_1_ = 'P';
                  uVar20._1_1_ = 'L';
                  uVar20._2_1_ = 'E';
                  uVar20._3_1_ = 'X';
                }
                goto LAB_001a0910;
              }
              sVar6 = strlen(comm);
              builtin_strncpy(comm + sVar6,": BIT",6);
            }
          }
          iVar3 = -datatype;
          if (0 < datatype) {
            iVar3 = datatype;
          }
          pcVar8 = tfmt;
          if (iVar3 == 0xc) {
            do {
              pcVar7 = pcVar8;
              pcVar8 = pcVar7 + 1;
            } while (*pcVar7 != 'S');
            *pcVar7 = 'B';
            ffpkys(fptr,name,tfmt,comm,status);
            ffkeyn("TZERO",iVar11,name,status);
            builtin_strncpy(comm + 0x10,"d bytes",8);
            builtin_strncpy(comm + 8,"or signe",8);
            uVar10 = 0xc0600000;
LAB_001a0b9f:
            builtin_strncpy(comm,"offset f",8);
            ffpkyg(fptr,name,(double)((ulong)uVar10 << 0x20),0,comm,status);
            ffkeyn("TSCAL",iVar11,name,status);
LAB_001a0be8:
            builtin_strncpy(comm,"data are not scaled",0x14);
            ffpkyg(fptr,name,1.0,0,comm,status);
          }
          else {
            if (iVar3 == 0x14) {
              do {
                pcVar7 = pcVar8;
                pcVar8 = pcVar7 + 1;
              } while (*pcVar7 != 'U');
              *pcVar7 = 'I';
              ffpkys(fptr,name,tfmt,comm,status);
              ffkeyn("TZERO",iVar11,name,status);
              builtin_strncpy(comm + 8,"or unsigned integers",0x15);
              uVar10 = 0x40e00000;
              goto LAB_001a0b9f;
            }
            if (iVar3 == 0x28) {
              do {
                pcVar7 = pcVar8;
                pcVar8 = pcVar7 + 1;
              } while (*pcVar7 != 'V');
              *pcVar7 = 'J';
              ffpkys(fptr,name,tfmt,comm,status);
              ffkeyn("TZERO",iVar11,name,status);
              builtin_strncpy(comm + 8,"or unsigned integers",0x15);
              uVar10 = 0x41e00000;
              goto LAB_001a0b9f;
            }
            if (iVar3 == 0x50) {
              do {
                pcVar7 = pcVar8;
                pcVar8 = pcVar7 + 1;
              } while (*pcVar7 != 'W');
              *pcVar7 = 'K';
              ffpkys(fptr,name,tfmt,comm,status);
              ffkeyn("TZERO",iVar11,card,status);
              sVar6 = strlen(card);
              builtin_strncpy(card + sVar6,"     ",6);
              card[8] = '\0';
              sVar6 = strlen(card);
              builtin_strncpy(card + sVar6,"=  9223372036854775808 / offset for unsigned integers",
                              0x36);
              ffprec(fptr,card,status);
              ffkeyn("TSCAL",iVar11,name,status);
              goto LAB_001a0be8;
            }
            ffpkys(fptr,name,tfmt,comm,status);
          }
          uVar2 = local_160;
          if (((local_188 != (char **)0x0) && (local_188[local_160] != (char *)0x0)) &&
             (*local_188[local_160] != '\0')) {
            ffkeyn("TUNIT",iVar11,name,status);
            ffpkys(fptr,name,local_188[uVar2],"physical unit of field",status);
          }
          uVar9 = uVar9 + 1;
        } while (*status < 1);
        if (extnm[0] != '\0') {
          ffpkys(fptr,"EXTNAME",extnm,"name of this binary table extension",status);
        }
        iVar11 = *status;
        if (0 < iVar11) {
          ffpmsg("Failed to write binary table header keywords (ffphbn)");
          iVar11 = *status;
        }
      }
      else {
        *status = 0xd8;
        iVar11 = 0xd8;
      }
    }
    else {
      *status = 0xc9;
      iVar11 = 0xc9;
    }
  }
  return iVar11;
}

Assistant:

int ffphbn(fitsfile *fptr,  /* I - FITS file pointer                        */
           LONGLONG naxis2,     /* I - number of rows in the table              */
           int tfields,     /* I - number of columns in the table           */
           char **ttype,    /* I - name of each column                      */
           char **tform,    /* I - value of TFORMn keyword for each column  */
           char **tunit,    /* I - value of TUNITn keyword for each column  */
           const char *extnmx,   /* I - value of EXTNAME keyword, if any         */
           LONGLONG pcount,     /* I - size of the variable length heap area    */
           int *status)     /* IO - error status                            */
/*
  Put required Header keywords into the Binary Table:
*/
{
    int ii, datatype, iread = 0;
    long repeat, width;
    LONGLONG naxis1;

    char tfmt[30], name[FLEN_KEYWORD], comm[FLEN_COMMENT], extnm[FLEN_VALUE];
    char *cptr, card[FLEN_CARD];
    tcolumn *colptr;

    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if ((fptr->Fptr)->headend != (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu] )
        return(*status = HEADER_NOT_EMPTY);
    else if (naxis2 < 0)
        return(*status = NEG_ROWS);
    else if (pcount < 0)
        return(*status = BAD_PCOUNT);
    else if (tfields < 0 || tfields > 999)
        return(*status = BAD_TFIELDS);

    extnm[0] = '\0';
    if (extnmx)
        strncat(extnm, extnmx, FLEN_VALUE-1);

    ffpkys(fptr, "XTENSION", "BINTABLE", "binary table extension", status);
    ffpkyj(fptr, "BITPIX", 8, "8-bit bytes", status);
    ffpkyj(fptr, "NAXIS", 2, "2-dimensional binary table", status);

    naxis1 = 0;
    for (ii = 0; ii < tfields; ii++)  /* sum the width of each field */
    {
        ffbnfm(tform[ii], &datatype, &repeat, &width, status);

        if (datatype == TSTRING)
            naxis1 += repeat;   /* one byte per char */
        else if (datatype == TBIT)
            naxis1 += (repeat + 7) / 8;
        else if (datatype > 0)
            naxis1 += repeat * (datatype / 10);
        else if (tform[ii][0] == 'P' || tform[ii][1] == 'P'||
                 tform[ii][0] == 'p' || tform[ii][1] == 'p')
           /* this is a 'P' variable length descriptor (neg. datatype) */
            naxis1 += 8;
        else
           /* this is a 'Q' variable length descriptor (neg. datatype) */
            naxis1 += 16;

        if (*status > 0)
            break;       /* abort loop on error */
    }

    ffpkyj(fptr, "NAXIS1", naxis1, "width of table in bytes", status);
    ffpkyj(fptr, "NAXIS2", naxis2, "number of rows in table", status);

    /*
      the initial value of PCOUNT (= size of the variable length array heap)
      should always be zero.  If any variable length data is written, then
      the value of PCOUNT will be updated when the HDU is closed
    */
    ffpkyj(fptr, "PCOUNT", 0, "size of special data area", status);
    ffpkyj(fptr, "GCOUNT", 1, "one data group (required keyword)", status);
    ffpkyj(fptr, "TFIELDS", tfields, "number of fields in each row", status);

    for (ii = 0; ii < tfields; ii++) /* loop over every column */
    {
        if ( *(ttype[ii]) )  /* optional TTYPEn keyword */
        {
          snprintf(comm, FLEN_COMMENT,"label for field %3d", ii + 1);
          ffkeyn("TTYPE", ii + 1, name, status);
          ffpkys(fptr, name, ttype[ii], comm, status);
        }

        if (strlen(tform[ii]) > 29)
        {
          ffpmsg("Error: BIN table TFORM code is too long (ffphbn)");
          *status = BAD_TFORM;
          break;
        }
        strcpy(tfmt, tform[ii]);  /* required TFORMn keyword */
        ffupch(tfmt);

        ffkeyn("TFORM", ii + 1, name, status);
        strcpy(comm, "data format of field");

        ffbnfm(tfmt, &datatype, &repeat, &width, status);

        if (datatype == TSTRING)
        {
            strcat(comm, ": ASCII Character");

            /* Do sanity check to see if an ASCII table format was used,  */
            /* e.g., 'A8' instead of '8A', or a bad unit width eg '8A9'.  */
            /* Don't want to return an error status, so write error into  */
            /* the keyword comment.  */

            cptr = strchr(tfmt,'A');
            cptr++;

            if (cptr)
               iread = sscanf(cptr,"%ld", &width);

            if (iread == 1 && (width > repeat)) 
            {
              if (repeat == 1)
                strcpy(comm, "ERROR??  USING ASCII TABLE SYNTAX BY MISTAKE??");
              else
                strcpy(comm, "rAw FORMAT ERROR! UNIT WIDTH w > COLUMN WIDTH r");
            }
        }
        else if (datatype == TBIT)
           strcat(comm, ": BIT");
        else if (datatype == TBYTE)
           strcat(comm, ": BYTE");
        else if (datatype == TLOGICAL)
           strcat(comm, ": 1-byte LOGICAL");
        else if (datatype == TSHORT)
           strcat(comm, ": 2-byte INTEGER");
        else if (datatype == TUSHORT)
           strcat(comm, ": 2-byte INTEGER");
        else if (datatype == TLONG)
           strcat(comm, ": 4-byte INTEGER");
        else if (datatype == TLONGLONG)
           strcat(comm, ": 8-byte INTEGER");
        else if (datatype == TULONG)
           strcat(comm, ": 4-byte INTEGER");
        else if (datatype == TULONGLONG)
           strcat(comm, ": 8-byte INTEGER");
        else if (datatype == TFLOAT)
           strcat(comm, ": 4-byte REAL");
        else if (datatype == TDOUBLE)
           strcat(comm, ": 8-byte DOUBLE");
        else if (datatype == TCOMPLEX)
           strcat(comm, ": COMPLEX");
        else if (datatype == TDBLCOMPLEX)
           strcat(comm, ": DOUBLE COMPLEX");
        else if (datatype < 0)
           strcat(comm, ": variable length array");

        if (abs(datatype) == TSBYTE) /* signed bytes */
        {
           /* Replace the 'S' with an 'B' in the TFORMn code */
           cptr = tfmt;
           while (*cptr != 'S') 
              cptr++;

           *cptr = 'B';
           ffpkys(fptr, name, tfmt, comm, status);

           /* write the TZEROn and TSCALn keywords */
           ffkeyn("TZERO", ii + 1, name, status);
           strcpy(comm, "offset for signed bytes");

           ffpkyg(fptr, name, -128., 0, comm, status);

           ffkeyn("TSCAL", ii + 1, name, status);
           strcpy(comm, "data are not scaled");
           ffpkyg(fptr, name, 1., 0, comm, status);
        }
        else if (abs(datatype) == TUSHORT) 
        {
           /* Replace the 'U' with an 'I' in the TFORMn code */
           cptr = tfmt;
           while (*cptr != 'U') 
              cptr++;

           *cptr = 'I';
           ffpkys(fptr, name, tfmt, comm, status);

           /* write the TZEROn and TSCALn keywords */
           ffkeyn("TZERO", ii + 1, name, status);
           strcpy(comm, "offset for unsigned integers");

           ffpkyg(fptr, name, 32768., 0, comm, status);

           ffkeyn("TSCAL", ii + 1, name, status);
           strcpy(comm, "data are not scaled");
           ffpkyg(fptr, name, 1., 0, comm, status);
        }
        else if (abs(datatype) == TULONG) 
        {
           /* Replace the 'V' with an 'J' in the TFORMn code */
           cptr = tfmt;
           while (*cptr != 'V') 
              cptr++;

           *cptr = 'J';
           ffpkys(fptr, name, tfmt, comm, status);

           /* write the TZEROn and TSCALn keywords */
           ffkeyn("TZERO", ii + 1, name, status);
           strcpy(comm, "offset for unsigned integers");

           ffpkyg(fptr, name, 2147483648., 0, comm, status);

           ffkeyn("TSCAL", ii + 1, name, status);
           strcpy(comm, "data are not scaled");
           ffpkyg(fptr, name, 1., 0, comm, status);
        }
        else if (abs(datatype) == TULONGLONG) 
        {	   
           /* Replace the 'W' with an 'K' in the TFORMn code */
           cptr = tfmt;
           while (*cptr != 'W') 
              cptr++;

           *cptr = 'K';
           ffpkys(fptr, name, tfmt, comm, status);

           /* write the TZEROn and TSCALn keywords */
           ffkeyn("TZERO", ii + 1, card, status);
           strcat(card, "     ");  /* make sure name is >= 8 chars long */
           *(card+8) = '\0';
	   strcat(card, "=  9223372036854775808 / offset for unsigned integers");
	   fits_write_record(fptr, card, status);

           ffkeyn("TSCAL", ii + 1, name, status);
           strcpy(comm, "data are not scaled");
           ffpkyg(fptr, name, 1., 0, comm, status);
        }
        else
        {
           ffpkys(fptr, name, tfmt, comm, status);
        }

        if (tunit)
        {
         if (tunit[ii] && *(tunit[ii]) ) /* optional TUNITn keyword */
         {
          ffkeyn("TUNIT", ii + 1, name, status);
          ffpkys(fptr, name, tunit[ii],
             "physical unit of field", status);
         }
        }

        if (*status > 0)
            break;       /* abort loop on error */
    }

    if (extnm[0])       /* optional EXTNAME keyword */
        ffpkys(fptr, "EXTNAME", extnm,
               "name of this binary table extension", status);

    if (*status > 0)
        ffpmsg("Failed to write binary table header keywords (ffphbn)");

    return(*status);
}